

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void build_eq(Grammar *g)

{
  State *pSVar1;
  State *pSVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  void *__s;
  long *plVar6;
  long *plVar7;
  EqState *gee;
  EqState *ge;
  EqState *ee;
  EqState *e;
  EqState *eq;
  State *ss;
  State *s;
  uint xx;
  uint x;
  uint changed;
  uint k;
  uint j;
  uint i;
  Grammar *g_local;
  
  bVar3 = true;
  __s = malloc((ulong)(g->states).n * 0x18);
  memset(__s,0,(ulong)(g->states).n * 0x18);
  do {
    if (!bVar3) {
      for (k = 0; k < (g->states).n; k = k + 1) {
        pSVar1 = (g->states).v[k];
        plVar6 = (long *)((long)__s + (ulong)pSVar1->index * 0x18);
        if ((*plVar6 != 0) && (2 < d_verbose_level)) {
          printf("eq %d %d ",(ulong)pSVar1->index,(ulong)*(uint *)*plVar6);
          if (plVar6[2] != 0) {
            printf("diff state (%d %d) ",(ulong)*(uint *)plVar6[2],
                   (ulong)**(uint **)((long)__s + (ulong)*(uint *)*plVar6 * 0x18 + 0x10));
          }
          if (plVar6[1] != 0) {
            printf("diff rule ");
            printf("[ ");
            print_rule((Rule *)plVar6[1]);
            printf("][ ");
            print_rule(*(Rule **)((long)__s + (ulong)*(uint *)*plVar6 * 0x18 + 8));
            printf("]");
          }
          printf("\n");
        }
      }
      for (k = 0; k < (g->states).n; k = k + 1) {
        pSVar1 = (g->states).v[k];
        plVar6 = (long *)((long)__s + (ulong)pSVar1->index * 0x18);
        if ((*plVar6 != 0) && (plVar6[2] != 0)) {
          if ((*(long *)((long)__s + (ulong)*(uint *)plVar6[2] * 0x18 + 8) == 0) ||
             (*(int *)(*(long *)((long)__s + (ulong)*(uint *)plVar6[2] * 0x18 + 8) + 0x20) != 2)) {
            if ((*(long *)((long)__s +
                          (ulong)**(uint **)((long)__s + (ulong)*(uint *)*plVar6 * 0x18 + 0x10) *
                          0x18 + 8) != 0) &&
               (*(int *)(*(long *)((long)__s +
                                  (ulong)**(uint **)((long)__s +
                                                    (ulong)*(uint *)*plVar6 * 0x18 + 0x10) * 0x18 +
                                  8) + 0x20) == 2)) {
              *(State **)(*plVar6 + 0x198) = pSVar1;
              pSVar1->reduces_with = (Rule *)plVar6[1];
              pSVar1->reduces_to_then_with =
                   *(Rule **)((long)__s + (ulong)*(uint *)*plVar6 * 0x18 + 8);
            }
          }
          else {
            pSVar1->reduces_to = (State *)*plVar6;
            pSVar1->reduces_with = *(Rule **)((long)__s + (ulong)*(uint *)*plVar6 * 0x18 + 8);
            pSVar1->reduces_to_then_with = (Rule *)plVar6[1];
          }
        }
      }
      for (k = 0; k < (g->states).n; k = k + 1) {
        pSVar1 = (g->states).v[k];
        if ((pSVar1->reduces_to != (State *)0x0) && (d_verbose_level != 0)) {
          printf("reduces_to %d %d\n",(ulong)pSVar1->index,(ulong)pSVar1->reduces_to->index);
        }
      }
      free(__s);
      return;
    }
    bVar3 = false;
    for (k = 0; k < (g->states).n; k = k + 1) {
      pSVar1 = (g->states).v[k];
      plVar6 = (long *)((long)__s + (ulong)pSVar1->index * 0x18);
      changed = k;
LAB_00141966:
      changed = changed + 1;
      if (changed < (g->states).n) {
        pSVar2 = (g->states).v[changed];
        plVar7 = (long *)((long)__s + (ulong)pSVar2->index * 0x18);
        if ((((*plVar6 == 0) && (*plVar7 == 0)) &&
            ((pSVar1->same_shifts == pSVar2->same_shifts || (pSVar2->same_shifts == pSVar1)))) &&
           ((pSVar1->gotos).n == (pSVar2->gotos).n)) {
          for (x = 0; x < (pSVar1->gotos).n; x = x + 1) {
            uVar4 = elem_symbol(g,(pSVar1->gotos).v[x]->elem);
            uVar5 = elem_symbol(g,(pSVar2->gotos).v[x]->elem);
            if (uVar4 != uVar5) goto LAB_00141966;
            if ((pSVar1->gotos).v[x]->state != (pSVar2->gotos).v[x]->state) {
              if (((*(State **)((long)__s + (ulong)(pSVar1->gotos).v[x]->state->index * 0x18) !=
                    (pSVar2->gotos).v[x]->state) &&
                  (*(State **)((long)__s + (ulong)(pSVar2->gotos).v[x]->state->index * 0x18) !=
                   (pSVar1->gotos).v[x]->state)) ||
                 (((plVar7[2] != 0 &&
                   (plVar7[2] !=
                    *(long *)((long)__s + (ulong)(pSVar2->gotos).v[x]->state->index * 0x18))) ||
                  ((plVar6[2] != 0 &&
                   (plVar6[2] !=
                    *(long *)((long)__s + (ulong)(pSVar1->gotos).v[x]->state->index * 0x18)))))))
              goto LAB_00141966;
              plVar7[2] = (long)(pSVar2->gotos).v[x]->state;
              plVar6[2] = (long)(pSVar1->gotos).v[x]->state;
            }
          }
          if ((pSVar1->reduce_actions).n == (pSVar2->reduce_actions).n) {
            for (x = 0; x < (pSVar1->reduce_actions).n; x = x + 1) {
              if ((pSVar1->reduce_actions).v[x]->rule != (pSVar2->reduce_actions).v[x]->rule) {
                if ((pSVar1->reduce_actions).v[x]->rule->prod !=
                    (pSVar2->reduce_actions).v[x]->rule->prod) goto LAB_00141966;
                if (((pSVar1->reduce_actions).v[x]->rule->elems).n !=
                    ((pSVar2->reduce_actions).v[x]->rule->elems).n) {
                  if (((plVar7[1] != 0) &&
                      ((Rule *)plVar7[1] != (pSVar2->reduce_actions).v[x]->rule)) ||
                     ((plVar6[1] != 0 && ((Rule *)plVar6[1] != (pSVar1->reduce_actions).v[x]->rule))
                     )) goto LAB_00141966;
                  plVar7[1] = (long)(pSVar2->reduce_actions).v[x]->rule;
                  plVar6[1] = (long)(pSVar1->reduce_actions).v[x]->rule;
                }
              }
            }
            *plVar7 = (long)pSVar1;
            bVar3 = true;
          }
        }
        goto LAB_00141966;
      }
    }
  } while( true );
}

Assistant:

void build_eq(Grammar *g) {
  uint i, j, k, changed = 1, x, xx;
  State *s, *ss;
  EqState *eq, *e, *ee;

  eq = (EqState *)MALLOC(sizeof(EqState) * g->states.n);
  memset(eq, 0, sizeof(EqState) * g->states.n);
  while (changed) {
    changed = 0;
    for (i = 0; i < g->states.n; i++) {
      s = g->states.v[i];
      e = &eq[s->index];
      for (j = i + 1; j < g->states.n; j++) {
        ss = g->states.v[j];
        ee = &eq[ss->index];
        if (e->eq || ee->eq) continue;
        if (s->same_shifts != ss->same_shifts && ss->same_shifts != s) continue;
        /* check gotos */
        if (s->gotos.n != ss->gotos.n) continue;
        for (k = 0; k < s->gotos.n; k++) {
          if (elem_symbol(g, s->gotos.v[k]->elem) != elem_symbol(g, ss->gotos.v[k]->elem)) goto Lcontinue;
          if (s->gotos.v[k]->state != ss->gotos.v[k]->state) {
            EqState *ge = &eq[s->gotos.v[k]->state->index];
            EqState *gee = &eq[ss->gotos.v[k]->state->index];
            if (ge->eq != ss->gotos.v[k]->state && gee->eq != s->gotos.v[k]->state) goto Lcontinue;
            if ((ee->diff_state && ee->diff_state != eq[ss->gotos.v[k]->state->index].eq) ||
                (e->diff_state && e->diff_state != eq[s->gotos.v[k]->state->index].eq))
              goto Lcontinue;
            /* allow one different state */
            ee->diff_state = ss->gotos.v[k]->state;
            e->diff_state = s->gotos.v[k]->state;
          }
        }
        /* check reductions */
        if (s->reduce_actions.n != ss->reduce_actions.n) continue;
        for (k = 0; k < s->reduce_actions.n; k++) {
          if (s->reduce_actions.v[k]->rule == ss->reduce_actions.v[k]->rule) continue;
          if (s->reduce_actions.v[k]->rule->prod != ss->reduce_actions.v[k]->rule->prod) goto Lcontinue;
          if ((x = s->reduce_actions.v[k]->rule->elems.n) != (xx = ss->reduce_actions.v[k]->rule->elems.n)) {
            if ((ee->diff_rule && ee->diff_rule != ss->reduce_actions.v[k]->rule) ||
                (e->diff_rule && e->diff_rule != s->reduce_actions.v[k]->rule))
              goto Lcontinue;
            /* allow one different rule */
            ee->diff_rule = ss->reduce_actions.v[k]->rule;
            e->diff_rule = s->reduce_actions.v[k]->rule;
          }
        }
        ee->eq = s;
        changed = 1;
      Lcontinue:;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq) {
      if (d_verbose_level > 2) {
        printf("eq %d %d ", s->index, e->eq->index);
        if (e->diff_state) printf("diff state (%d %d) ", e->diff_state->index, eq[e->eq->index].diff_state->index);
        if (e->diff_rule) {
          printf("diff rule ");
          printf("[ ");
          print_rule(e->diff_rule);
          printf("][ ");
          print_rule(eq[e->eq->index].diff_rule);
          printf("]");
        }
        printf("\n");
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    e = &eq[s->index];
    if (e->eq && e->diff_state) {
      if (eq[e->diff_state->index].diff_rule && eq[e->diff_state->index].diff_rule->elems.n == 2) {
        s->reduces_to = e->eq;
        s->reduces_with = eq[e->eq->index].diff_rule;
        s->reduces_to_then_with = e->diff_rule;
      } else if (eq[eq[e->eq->index].diff_state->index].diff_rule &&
                 eq[eq[e->eq->index].diff_state->index].diff_rule->elems.n == 2) {
        e->eq->reduces_to = s;
        s->reduces_with = e->diff_rule;
        s->reduces_to_then_with = eq[e->eq->index].diff_rule;
      }
    }
  }
  for (i = 0; i < g->states.n; i++) {
    s = g->states.v[i];
    if (s->reduces_to)
      if (d_verbose_level) printf("reduces_to %d %d\n", s->index, s->reduces_to->index);
  }
  FREE(eq);
}